

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  undefined1 *puVar1;
  void *pvVar2;
  bool bVar3;
  undefined4 uVar4;
  char cVar5;
  _Bool _Var6;
  byte bVar7;
  ushort uVar8;
  CURLUcode CVar9;
  int iVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  size_t sVar13;
  connectdata *conn;
  char *pcVar14;
  CURLU *u;
  size_t sVar15;
  stsentry *psVar16;
  ulong ulnum;
  Curl_handler *pCVar17;
  long lVar18;
  connectbundle *bundle;
  connectdata *pcVar19;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  char **ppcVar23;
  ConnectBits CVar24;
  char *pcVar25;
  curltime cVar26;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *existing;
  char *newurl;
  char *local_f8;
  _Bool local_ef;
  _Bool local_ee;
  _Bool local_ed;
  curl_proxytype local_ec;
  size_t local_e8;
  proxy_info *local_e0;
  size_t local_d8;
  _Bool *local_d0;
  _Bool *local_c8;
  connectdata *local_c0;
  char *local_b8 [17];
  
  conn = (connectdata *)0x0;
  *asyncp = false;
  Curl_free_request_state(data);
  memset(&(data->req).bytecount,0,0xb0);
  *(undefined4 *)&(data->req).size = 0xffffffff;
  *(undefined4 *)((long)&(data->req).size + 4) = 0xffffffff;
  *(undefined4 *)&(data->req).maxdownload = 0xffffffff;
  *(undefined4 *)((long)&(data->req).maxdownload + 4) = 0xffffffff;
  *(ushort *)&(data->req).field_0xbb = (ushort)(*(uint *)&(data->set).field_0x8ba >> 0xf) & 0x1000;
  local_c0 = (connectdata *)0x0;
  local_ed = false;
  local_ef = false;
  local_e8 = Curl_multi_max_host_connections(data->multi);
  sVar13 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  CVar12 = CURLE_URL_MALFORMAT;
  CVar11 = CVar12;
  if ((data->state).url == (char *)0x0) goto switchD_00681453_caseD_1;
  conn = (connectdata *)(*Curl_ccalloc)(1,0x488);
  if (conn == (connectdata *)0x0) {
LAB_006814a5:
    conn = (connectdata *)0x0;
    goto switchD_00681453_caseD_7;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  conn->port = -1;
  conn->remote_port = -1;
  Curl_conncontrol(conn,1);
  cVar26 = Curl_now();
  (conn->created).tv_sec = cVar26.tv_sec;
  (conn->created).tv_usec = cVar26.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar7 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar7;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar14 = (data->set).str[0x15];
  if ((pcVar14 == (char *)0x0) || (*pcVar14 == '\0')) {
    uVar20 = (uint)conn->bits & 0xffffffde;
    uVar21 = 0;
  }
  else {
    uVar20 = ((uint)conn->bits & 0xffffffde) + (uint)(bVar7 < 4) + 0x20;
    uVar21 = (uint)(bVar7 >= 4) * 2;
  }
  CVar24 = (ConnectBits)(uVar20 & 0xfffffffd | uVar21);
  conn->bits = CVar24;
  pcVar14 = (data->set).str[0x16];
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    CVar24 = (ConnectBits)(uVar20 | 0x22);
    conn->bits = CVar24;
  }
  CVar24 = (ConnectBits)
           (((uint)CVar24 & 0xfffffffb) + (uint)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar24;
  uVar21 = *(uint *)&(data->set).field_0x8ba >> 5 & 8;
  conn->bits = (ConnectBits)((uint)CVar24 & 0xfffffff7 | uVar21);
  uVar20 = (*(uint *)&(data->set).field_0x8ba & 0x2000) << 4;
  conn->bits = (ConnectBits)((uint)CVar24 & 0xfffdfff7 | uVar21 | uVar20);
  conn->bits = (ConnectBits)
               ((uint)CVar24 & 0xfff9fff7 | uVar21 | uVar20 |
               (*(uint *)&(data->set).field_0x8ba & 0x4000) << 4);
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).connect_only;
  conn->transport = '\x03';
  Curl_llist_init(&conn->easyq,(Curl_llist_dtor)0x0);
  pcVar14 = (data->set).str[8];
  if (pcVar14 != (char *)0x0) {
    pcVar14 = (*Curl_cstrdup)(pcVar14);
    conn->localdev = pcVar14;
    if (pcVar14 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      goto LAB_006814a5;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar2 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar2;
  iVar10 = (conn->created).tv_usec;
  uVar4 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar10;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar4;
  conn->gssapi_delegation = (data->set).gssapi_delegation;
  local_d8 = sVar13;
  local_d0 = asyncp;
  local_c8 = protocol_done;
  if ((data->set).uh == (CURLU *)0x0) {
    up_free(data);
LAB_00681381:
    bVar3 = false;
    u = curl_url();
  }
  else {
    bVar7 = (data->state).field_0x74c;
    up_free(data);
    if ((bVar7 & 2) != 0) goto LAB_00681381;
    u = curl_url_dup((data->set).uh);
    bVar3 = true;
  }
  (data->state).uh = u;
  if (u == (CURLU *)0x0) goto switchD_00681453_caseD_7;
  if (((data->set).str[7] != (char *)0x0) &&
     (sVar13 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar13 == 0)) {
    pcVar14 = curl_maprintf("%s://%s",(data->set).str[7],(data->state).url);
    if (pcVar14 == (char *)0x0) goto switchD_00681453_caseD_7;
    uVar21 = *(uint *)&(data->state).field_0x74c;
    if ((uVar21 >> 0x10 & 1) != 0) {
      (*Curl_cfree)((data->state).url);
      uVar21 = *(uint *)&(data->state).field_0x74c;
    }
    (data->state).url = pcVar14;
    *(uint *)&(data->state).field_0x74c = uVar21 | 0x10000;
  }
  if (!bVar3) {
    uVar21 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x8ba >> 0x20);
    CVar9 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                         (uVar21 >> 0xb & 0x20) + (uVar21 >> 6 & 0x10) + 0x208);
    if (CVar9 == CURLUE_OK) {
      CVar9 = curl_url_get(u,CURLUPART_URL,local_b8,0);
      CVar11 = CURLE_URL_MALFORMAT;
      switch(CVar9) {
      case CURLUE_OK:
        uVar21 = *(uint *)&(data->state).field_0x74c;
        if ((uVar21 >> 0x10 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar21 = *(uint *)&(data->state).field_0x74c;
        }
        (data->state).url = local_b8[0];
        *(uint *)&(data->state).field_0x74c = uVar21 | 0x10000;
        goto LAB_00681425;
      case CURLUE_UNSUPPORTED_SCHEME:
        CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
        CVar11 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
        CVar11 = CURLE_LOGIN_DENIED;
      }
    }
    else {
      pcVar14 = curl_url_strerror(CVar9);
      Curl_failf(data,"URL rejected: %s",pcVar14);
      CVar11 = CURLE_URL_MALFORMAT;
      if (CVar9 - CURLUE_UNSUPPORTED_SCHEME < 4) {
        CVar11 = *(CURLcode *)(&DAT_008ef43c + (ulong)(CVar9 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      }
    }
    goto switchD_00681453_caseD_1;
  }
LAB_00681425:
  part = &(data->state).up;
  CVar9 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
  CVar11 = CVar12;
  switch(CVar9) {
  case CURLUE_OK:
    ppcVar23 = &(data->state).up.hostname;
    CVar9 = curl_url_get(u,CURLUPART_HOST,ppcVar23,0);
    if (CVar9 == CURLUE_OK) {
      pcVar14 = *ppcVar23;
      sVar15 = strlen(pcVar14);
      if (0xffff < sVar15) {
        Curl_failf(data,"Too long host name (maximum is %d)",0xffff);
        goto switchD_00681453_caseD_1;
      }
    }
    else {
      iVar10 = curl_strequal("file",part->scheme);
      if (iVar10 == 0) goto switchD_00681453_caseD_7;
      pcVar14 = *ppcVar23;
    }
    if (pcVar14 == (char *)0x0) {
      pcVar22 = (char *)0x0;
    }
    else {
      pcVar22 = pcVar14;
      if (*pcVar14 == '[') {
        puVar1 = &(conn->bits).field_0x1;
        *puVar1 = *puVar1 | 8;
        pcVar22 = pcVar14 + 1;
        sVar15 = strlen(pcVar22);
        pcVar14[sVar15] = '\0';
        zonefrom_url(u,data,conn);
      }
    }
    if (pcVar22 == (char *)0x0) {
      pcVar22 = "";
    }
    pcVar14 = (*Curl_cstrdup)(pcVar22);
    (conn->host).rawalloc = pcVar14;
    if (pcVar14 == (char *)0x0) goto switchD_00681453_caseD_7;
    (conn->host).name = pcVar14;
    CVar11 = Curl_idnconvert_hostname(&conn->host);
    if (CVar11 != CURLE_OK) goto switchD_00681453_caseD_1;
    if (((data->hsts != (hsts *)0x0) && (iVar10 = curl_strequal("http",part->scheme), iVar10 != 0))
       && (psVar16 = Curl_hsts(data->hsts,(conn->host).name,true), psVar16 != (stsentry *)0x0)) {
      (*Curl_cfree)(part->scheme);
      part->scheme = (char *)0x0;
      CVar9 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
      CVar11 = CURLE_URL_MALFORMAT;
      switch(CVar9) {
      case CURLUE_OK:
        if (((data->state).field_0x74e & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          (data->state).url = (char *)0x0;
        }
        CVar9 = curl_url_get(u,CURLUPART_URL,local_b8,0);
        switch(CVar9) {
        case CURLUE_OK:
          local_ec = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
          if (local_ec == CURLPROXY_HTTP) {
            (data->state).url = local_b8[0];
            puVar1 = &(data->state).field_0x74e;
            *puVar1 = *puVar1 | 1;
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
            }
            goto LAB_00681816;
          }
          (*Curl_cfree)(local_b8[0]);
          if (local_ec - CURLPROXY_SOCKS5 < 4) {
            CVar11 = *(CURLcode *)(&DAT_008ef43c + (ulong)(local_ec - CURLPROXY_SOCKS5) * 4);
          }
          break;
        case CURLUE_UNSUPPORTED_SCHEME:
          goto switchD_00681740_caseD_5;
        case CURLUE_OUT_OF_MEMORY:
          goto switchD_00681740_caseD_7;
        case CURLUE_USER_NOT_ALLOWED:
          goto switchD_00681740_caseD_8;
        }
        break;
      case CURLUE_UNSUPPORTED_SCHEME:
switchD_00681740_caseD_5:
        CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
        break;
      case CURLUE_OUT_OF_MEMORY:
switchD_00681740_caseD_7:
        CVar11 = CURLE_OUT_OF_MEMORY;
        break;
      case CURLUE_USER_NOT_ALLOWED:
switchD_00681740_caseD_8:
        CVar11 = CURLE_LOGIN_DENIED;
      }
      goto switchD_00681453_caseD_1;
    }
LAB_00681816:
    CVar11 = findprotocol(data,conn,(data->state).up.scheme);
    if (CVar11 != CURLE_OK) goto switchD_00681453_caseD_5;
    if ((data->set).str[0x2b] == (char *)0x0) {
      ppcVar23 = &(data->state).up.password;
      CVar9 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar23,0);
      switch(CVar9) {
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00681453_caseD_5;
      case CURLUE_URLDECODE:
      case CURLUE_UNKNOWN_PART:
      case CURLUE_NO_SCHEME:
      case CURLUE_NO_USER:
switchD_006818b6_caseD_6:
        CVar11 = CURLE_URL_MALFORMAT;
        goto switchD_00681453_caseD_1;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00681453_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00681453_caseD_8;
      case CURLUE_NO_PASSWORD:
        break;
      default:
        if (CVar9 != CURLUE_OK) goto switchD_006818b6_caseD_6;
        CVar11 = Curl_urldecode(*ppcVar23,0,local_b8,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar11 != CURLE_OK) goto switchD_00681453_caseD_1;
        conn->passwd = local_b8[0];
        CVar11 = Curl_setstropt(&(data->state).aptr.passwd,local_b8[0]);
        if (CVar11 != CURLE_OK) goto switchD_00681453_caseD_1;
      }
    }
    if ((data->set).str[0x2a] == (char *)0x0) {
      ppcVar23 = &(data->state).up.user;
      CVar9 = curl_url_get(u,CURLUPART_USER,ppcVar23,0);
      CVar11 = CVar12;
      switch(CVar9) {
      case CURLUE_OK:
        CVar11 = Curl_urldecode(*ppcVar23,0,local_b8,(size_t *)0x0,
                                ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
        if (CVar11 != CURLE_OK) goto switchD_00681453_caseD_1;
        conn->user = local_b8[0];
        break;
      default:
        goto switchD_00681453_caseD_1;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_00681453_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_00681453_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_00681453_caseD_8;
      case CURLUE_NO_USER:
        if ((data->state).aptr.passwd == (char *)0x0) goto LAB_0068184b;
        local_b8[0] = "";
      }
      CVar11 = Curl_setstropt(&(data->state).aptr.user,local_b8[0]);
      if (CVar11 != CURLE_OK) goto switchD_00681453_caseD_1;
    }
    break;
  default:
    goto switchD_00681453_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_00681453_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_00681453_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_00681453_caseD_8:
    CVar11 = CURLE_LOGIN_DENIED;
    goto switchD_00681453_caseD_1;
  }
LAB_0068184b:
  ppcVar23 = &(data->state).up.options;
  CVar9 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar23,0x40);
  CVar11 = CVar12;
  switch(CVar9) {
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_00681453_caseD_5:
    CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
    break;
  case CURLUE_URLDECODE:
  case CURLUE_UNKNOWN_PART:
  case CURLUE_NO_SCHEME:
  case CURLUE_NO_USER:
  case CURLUE_NO_PASSWORD:
    break;
  case CURLUE_USER_NOT_ALLOWED:
    goto switchD_00681453_caseD_8;
  case CURLUE_NO_OPTIONS:
switchD_00681881_caseD_d:
    CVar9 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
    switch(CVar9) {
    case CURLUE_OK:
      CVar9 = curl_url_get(u,CURLUPART_PORT,&(data->state).up.port,1);
      if (CVar9 == CURLUE_OK) {
        ulnum = strtoul((data->state).up.port,(char **)0x0,10);
        uVar8 = (data->set).use_port;
        if ((uVar8 == 0) || (((data->state).field_0x74c & 0x10) == 0)) {
          uVar8 = curlx_ultous(ulnum);
        }
        conn->remote_port = (uint)uVar8;
        conn->port = (uint)uVar8;
      }
      else {
        iVar10 = curl_strequal("file",part->scheme);
        if (iVar10 == 0) goto switchD_00681453_caseD_7;
      }
      curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
      uVar21 = (data->set).scope_id;
      if (uVar21 != 0) {
        conn->scope_id = uVar21;
      }
      pcVar14 = (data->set).str[0x46];
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        conn->sasl_authzid = pcVar14;
        if (pcVar14 == (char *)0x0) goto switchD_00681453_caseD_7;
      }
      pcVar14 = (data->set).str[0x40];
      if (pcVar14 != (char *)0x0) {
        pcVar14 = (*Curl_cstrdup)(pcVar14);
        conn->oauth_bearer = pcVar14;
        if (pcVar14 == (char *)0x0) goto switchD_00681453_caseD_7;
      }
      local_ee = false;
      if (((uint)conn->bits & 4) == 0) {
LAB_00681b1d:
        pcVar14 = (data->set).str[0x15];
        if (pcVar14 == (char *)0x0) {
          local_f8 = (char *)0x0;
        }
        else {
          local_f8 = (*Curl_cstrdup)(pcVar14);
          if (local_f8 == (char *)0x0) {
            Curl_failf(data,"memory shortage");
            CVar11 = CURLE_OUT_OF_MEMORY;
            goto LAB_00681f24;
          }
        }
        pcVar14 = (data->set).str[0x16];
        if (pcVar14 == (char *)0x0) {
          pcVar14 = (char *)0x0;
LAB_00681c10:
          if ((data->set).str[0x2f] == (char *)0x0) {
            pcVar25 = "no_proxy";
            pcVar22 = curl_getenv("no_proxy");
            if (pcVar22 == (char *)0x0) {
              pcVar25 = "NO_PROXY";
              pcVar22 = curl_getenv("NO_PROXY");
              if (pcVar22 == (char *)0x0) goto LAB_00681c1e;
            }
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar25,pcVar22);
            }
          }
          else {
LAB_00681c1e:
            pcVar22 = (char *)0x0;
          }
          pcVar25 = (data->set).str[0x2f];
          if (pcVar25 == (char *)0x0) {
            pcVar25 = pcVar22;
          }
          _Var6 = Curl_check_noproxy((conn->host).name,pcVar25,&local_ee);
          if (_Var6) {
            (*Curl_cfree)(local_f8);
            (*Curl_cfree)(pcVar14);
            local_f8 = (char *)0x0;
LAB_00681c5f:
            pcVar14 = (char *)0x0;
          }
          else if (local_f8 == (char *)0x0 && pcVar14 == (char *)0x0) {
            pcVar25 = conn->handler->scheme;
            cVar5 = *pcVar25;
            pcVar14 = (char *)local_b8;
            ppcVar23 = (char **)pcVar14;
            if (cVar5 != '\0') {
              ppcVar23 = local_b8;
              do {
                pcVar25 = pcVar25 + 1;
                cVar5 = Curl_raw_tolower(cVar5);
                *(char *)ppcVar23 = cVar5;
                ppcVar23 = (char **)((long)ppcVar23 + 1);
                cVar5 = *pcVar25;
              } while (cVar5 != '\0');
            }
            builtin_strncpy((char *)((long)ppcVar23 + 3),"oxy",4);
            *(undefined4 *)ppcVar23 = 0x6f72705f;
            local_f8 = curl_getenv(pcVar14);
            if (local_f8 == (char *)0x0) {
              pcVar14 = (char *)local_b8;
              iVar10 = curl_strequal("http_proxy",pcVar14);
              if (iVar10 == 0) {
                Curl_strntoupper(pcVar14,pcVar14,0x80);
                local_f8 = curl_getenv(pcVar14);
                if (local_f8 != (char *)0x0) goto LAB_006822e6;
              }
              pcVar14 = "all_proxy";
              local_f8 = curl_getenv("all_proxy");
              if (local_f8 == (char *)0x0) {
                pcVar14 = "ALL_PROXY";
                local_f8 = curl_getenv("ALL_PROXY");
              }
            }
LAB_006822e6:
            if ((data != (Curl_easy *)0x0 && local_f8 != (char *)0x0) &&
               (((data->set).field_0x8bd & 0x10) != 0)) {
              Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar14,local_f8);
            }
            goto LAB_00681c5f;
          }
          if (((data != (Curl_easy *)0x0) && (local_ee != false)) &&
             (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"space-separated NOPROXY patterns are deprecated");
          }
          (*Curl_cfree)(pcVar22);
          if (local_f8 == (char *)0x0) {
LAB_00681cd0:
            local_f8 = (char *)0x0;
          }
          else if ((*local_f8 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
            (*Curl_cfree)(local_f8);
            goto LAB_00681cd0;
          }
          if (pcVar14 == (char *)0x0) {
LAB_00681d27:
            if (local_f8 != (char *)0x0) {
              local_ec = (curl_proxytype)(conn->http_proxy).proxytype;
              pcVar14 = (char *)0x0;
              bVar3 = false;
LAB_00681d50:
              local_e0 = &conn->http_proxy;
              CVar11 = parse_proxy(data,conn,local_f8,local_ec);
              (*Curl_cfree)(local_f8);
              if (CVar11 == CURLE_OK) {
                if (bVar3) goto LAB_00681ef2;
                goto LAB_006821fd;
              }
              local_f8 = (char *)0x0;
              goto LAB_00681f27;
            }
            uVar21 = (uint)conn->bits & 0xfffffffc;
          }
          else {
            if ((*pcVar14 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
              (*Curl_cfree)(pcVar14);
              goto LAB_00681d27;
            }
            local_e0 = &conn->http_proxy;
            local_ec = (curl_proxytype)(conn->http_proxy).proxytype;
            bVar3 = true;
            if (local_f8 != (char *)0x0) goto LAB_00681d50;
LAB_00681ef2:
            CVar11 = parse_proxy(data,conn,pcVar14,local_ec);
            (*Curl_cfree)(pcVar14);
            if (CVar11 != CURLE_OK) goto LAB_00681f24;
LAB_006821fd:
            if ((local_e0->host).rawalloc == (char *)0x0) {
              CVar24 = (ConnectBits)((uint)conn->bits & 0xfffffff6);
              conn->bits = CVar24;
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0068233b;
              if ((conn->socks_proxy).user == (char *)0x0) {
                pcVar14 = (conn->socks_proxy).passwd;
                (conn->socks_proxy).user = (conn->http_proxy).user;
                (conn->http_proxy).user = (char *)0x0;
                (*Curl_cfree)(pcVar14);
                (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                (conn->http_proxy).passwd = (char *)0x0;
                CVar24 = conn->bits;
              }
            }
            else {
              CVar24 = conn->bits;
              if ((conn->handler->protocol & 3) == 0) {
                if (((conn->handler->flags & 0x800) == 0) || (((uint)CVar24 & 8) != 0)) {
                  CVar24 = (ConnectBits)((uint)CVar24 | 8);
                }
                else {
                  conn->handler = &Curl_handler_http;
                }
              }
              CVar24 = (ConnectBits)((uint)CVar24 | 1);
              if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0068233b:
                uVar21 = (uint)CVar24 & 0xfffffffd;
                goto LAB_0068233e;
              }
            }
            uVar21 = (uint)CVar24 | 2;
          }
LAB_0068233e:
          uVar20 = 0x20;
          if ((uVar21 & 1) == 0) {
            uVar20 = (uVar21 & 2) << 4;
          }
          conn->bits = (ConnectBits)(uVar21 & 0xffffffdf | uVar20);
          if (uVar20 == 0) {
            conn->bits = (ConnectBits)(uVar21 & 0xffffffd0);
            (conn->http_proxy).proxytype = '\0';
          }
          local_f8 = (char *)0x0;
          pcVar14 = (char *)0x0;
          CVar11 = CURLE_OK;
        }
        else {
          pcVar14 = (*Curl_cstrdup)(pcVar14);
          if (pcVar14 != (char *)0x0) goto LAB_00681c10;
          pcVar14 = (char *)0x0;
          Curl_failf(data,"memory shortage");
          CVar11 = CURLE_OUT_OF_MEMORY;
        }
      }
      else {
        pcVar14 = (data->state).aptr.proxyuser;
        pcVar22 = (data->state).aptr.proxypasswd;
        if (pcVar14 == (char *)0x0) {
          pcVar14 = "";
        }
        if (pcVar22 == (char *)0x0) {
          pcVar22 = "";
        }
        ppcVar23 = &(conn->http_proxy).user;
        CVar11 = Curl_urldecode(pcVar14,0,ppcVar23,(size_t *)0x0,REJECT_ZERO);
        if ((CVar11 == CURLE_OK) &&
           (CVar11 = Curl_setstropt(&(data->state).aptr.proxyuser,*ppcVar23), CVar11 == CURLE_OK)) {
          ppcVar23 = &(conn->http_proxy).passwd;
          CVar11 = Curl_urldecode(pcVar22,0,ppcVar23,(size_t *)0x0,REJECT_ZERO);
          if ((CVar11 == CURLE_OK) &&
             (CVar11 = Curl_setstropt(&(data->state).aptr.proxypasswd,*ppcVar23), CVar11 == CURLE_OK
             )) goto LAB_00681b1d;
        }
LAB_00681f24:
        local_f8 = (char *)0x0;
        pcVar14 = (char *)0x0;
      }
LAB_00681f27:
      (*Curl_cfree)(pcVar14);
      (*Curl_cfree)(local_f8);
      if (CVar11 != CURLE_OK) break;
      if (((conn->given->flags & 1) != 0) && (((uint)conn->bits & 1) != 0)) {
        conn->bits = (ConnectBits)((uint)conn->bits | 8);
      }
      uVar8 = (data->set).use_port;
      if ((uVar8 != 0) && (((data->state).field_0x74c & 0x10) != 0)) {
        conn->remote_port = (uint)uVar8;
        curl_msnprintf((char *)local_b8,0x10,"%d");
        CVar9 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_b8,0);
        if (CVar9 != CURLUE_OK) goto switchD_00681453_caseD_7;
      }
      CVar11 = override_login(data,conn);
      if (((CVar11 != CURLE_OK) || (CVar11 = set_login(data,conn), CVar11 != CURLE_OK)) ||
         (CVar11 = parse_connect_to_slist(data,conn,(data->set).connect_to), CVar11 != CURLE_OK))
      break;
      CVar24 = conn->bits;
      if (((uint)CVar24 & 1) != 0) {
        CVar11 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
        if (CVar11 != CURLE_OK) break;
        CVar24 = conn->bits;
      }
      if (((uint)CVar24 & 2) != 0) {
        CVar11 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
        if (CVar11 != CURLE_OK) break;
        CVar24 = conn->bits;
      }
      if (((uint)CVar24 >> 9 & 1) != 0) {
        CVar11 = Curl_idnconvert_hostname(&conn->conn_to_host);
        if (CVar11 != CURLE_OK) break;
        CVar24 = conn->bits;
        if (((uint)CVar24 >> 9 & 1) != 0) {
          iVar10 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
          CVar24 = conn->bits;
          if (iVar10 != 0) {
            CVar24 = (ConnectBits)((uint)CVar24 & 0xfffffdff);
            conn->bits = CVar24;
          }
        }
      }
      if ((((uint)CVar24 >> 10 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
        CVar24 = (ConnectBits)((uint)CVar24 & 0xfffffbff);
        conn->bits = CVar24;
      }
      if (((uint)CVar24 & 1) != 0 && ((uint)CVar24 & 0x600) != 0) {
        conn->bits = (ConnectBits)((uint)CVar24 | 8);
      }
      pCVar17 = conn->handler;
      if (pCVar17->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
        CVar11 = (*pCVar17->setup_connection)(data,conn);
        if (CVar11 != CURLE_OK) break;
        pCVar17 = conn->handler;
      }
      if (conn->port < 0) {
        conn->port = pCVar17->defport;
      }
      if ((pCVar17->flags & 0x10) == 0) {
        conn->recv[0] = Curl_conn_recv;
        conn->send[0] = Curl_conn_send;
        conn->recv[1] = Curl_conn_recv;
        conn->send[1] = Curl_conn_send;
        conn->bits = (ConnectBits)
                     ((uint)conn->bits & 0xfeffffff | *(uint *)&(data->set).field_0x8bc & 0x1000000)
        ;
        CVar11 = Curl_ssl_easy_config_complete(data);
        if (CVar11 != CURLE_OK) break;
        prune_dead_connections(data);
        if (((((data->set).field_0x8bd & 0x80) == 0) || ((data->state).followlocation != 0)) &&
           (((data->set).connect_only == '\0' &&
            (_Var6 = ConnectionExists(data,conn,&local_c0,&local_ed,&local_ef), pcVar19 = local_c0,
            _Var6)))) {
          reuse_conn(data,conn,local_c0);
          conn = pcVar19;
          if (((data->set).field_0x8bd & 0x10) != 0) {
            pcVar14 = "proxy";
            if (((uint)pcVar19->bits & 0x20) == 0) {
              pcVar14 = "host";
            }
            lVar18 = 0xa8;
            if (((pcVar19->socks_proxy).host.name == (char *)0x0) &&
               (lVar18 = 0xe0, (pcVar19->http_proxy).host.name == (char *)0x0)) {
              lVar18 = 0x58;
            }
            Curl_infof(data,"Re-using existing connection with %s %s",pcVar14,
                       *(undefined8 *)((long)&(pcVar19->bundle_node).ptr + lVar18));
          }
        }
        else {
          if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8bf & 2) != 0)) {
            puVar1 = &(conn->bits).field_0x3;
            *puVar1 = *puVar1 | 2;
          }
          if (local_ef != false) {
LAB_006824a0:
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"No connections available.");
            }
            conn_free(data,conn);
            CVar11 = CURLE_NO_CONNECTION_AVAILABLE;
            conn = (connectdata *)0x0;
            break;
          }
          bundle = Curl_conncache_find_bundle(data,conn,(data->state).conn_cache);
          if ((bundle == (connectbundle *)0x0 || local_e8 == 0) ||
             (bundle->num_connections < local_e8)) {
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
            }
          }
          else {
            pcVar19 = Curl_conncache_extract_bundle(data,bundle);
            if (data->share != (Curl_share *)0x0) {
              Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
            }
            if (pcVar19 == (connectdata *)0x0) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"No more connections allowed to host: %zu",local_e8);
              }
              goto LAB_006824a0;
            }
            Curl_disconnect(data,pcVar19,false);
          }
          if ((local_d8 != 0) && (sVar13 = Curl_conncache_size(data), local_d8 <= sVar13)) {
            pcVar19 = Curl_conncache_extract_oldest(data);
            if (pcVar19 == (connectdata *)0x0) {
              if (((data->set).field_0x8bd & 0x10) != 0) {
                Curl_infof(data,"No connections available in cache");
              }
              goto LAB_006824a0;
            }
            Curl_disconnect(data,pcVar19,false);
          }
          CVar11 = Curl_ssl_conn_config_init(data,conn);
          if (CVar11 != CURLE_OK) break;
          Curl_attach_connection(data,conn);
          CVar11 = Curl_conncache_add_conn(data);
          if (CVar11 != CURLE_OK) break;
          if ((((data->state).authhost.picked & 0x28) != 0) &&
             (bVar7 = (data->state).authhost.field_0x18, (bVar7 & 1) != 0)) {
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"NTLM picked AND auth done set, clear picked");
              bVar7 = (data->state).authhost.field_0x18;
            }
            (data->state).authhost.picked = 0;
            (data->state).authhost.field_0x18 = bVar7 & 0xfe;
          }
          if ((((data->state).authproxy.picked & 0x28) != 0) &&
             (bVar7 = (data->state).authproxy.field_0x18, (bVar7 & 1) != 0)) {
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
              bVar7 = (data->state).authproxy.field_0x18;
            }
            (data->state).authproxy.picked = 0;
            (data->state).authproxy.field_0x18 = bVar7 & 0xfe;
          }
        }
        Curl_init_do(data,conn);
        CVar11 = setup_range(data);
        if (CVar11 != CURLE_OK) break;
        conn->seek_func = (data->set).seek_func;
        conn->seek_client = (data->set).seek_client;
        CVar11 = resolve_server(data,conn,local_d0);
        if (CVar11 != CURLE_OK) break;
        CVar11 = Curl_conn_ev_data_setup(data);
      }
      else {
        Curl_persistconninfo(data,conn,(char *)0x0,-1);
        CVar12 = (*conn->handler->connect_it)(data,(_Bool *)local_b8);
        if (CVar12 == CURLE_OK) {
          Curl_attach_connection(data,conn);
          CVar11 = Curl_conncache_add_conn(data);
          if (CVar11 == CURLE_OK) {
            CVar11 = setup_range(data);
            if (CVar11 == CURLE_OK) {
              Curl_setup_transfer(data,-1,-1,false,-1);
              goto LAB_00682407;
            }
            (*conn->handler->done)(data,CVar11,false);
          }
        }
        else {
LAB_00682407:
          Curl_init_do(data,conn);
          CVar11 = CVar12;
        }
      }
      if (CVar11 == CURLE_OK) {
        if (1 < (conn->easyq).size) {
          *local_c8 = true;
          return CURLE_OK;
        }
        if (*local_d0 != false) {
          return CURLE_OK;
        }
        CVar11 = Curl_setup_conn(data,local_c8);
      }
    default:
      break;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_00681453_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_00681453_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_00681453_caseD_8;
    }
  default:
    if (CVar9 != CURLUE_OK) break;
    pcVar14 = (*Curl_cstrdup)(*ppcVar23);
    conn->options = pcVar14;
    if (pcVar14 != (char *)0x0) goto switchD_00681881_caseD_d;
  case CURLUE_OUT_OF_MEMORY:
switchD_00681453_caseD_7:
    CVar11 = CURLE_OUT_OF_MEMORY;
  }
switchD_00681453_caseD_1:
  CVar12 = CURLE_NO_CONNECTION_AVAILABLE;
  if (((CVar11 != CURLE_NO_CONNECTION_AVAILABLE) && (CVar12 = CVar11, conn != (connectdata *)0x0))
     && (CVar11 != CURLE_OK)) {
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data,conn,true);
    Curl_disconnect(data,conn,true);
  }
  return CVar12;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.size = data->req.maxdownload = -1;
  data->req.no_body = data->set.opt_no_body;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conncache_remove_conn(data, conn, TRUE);
    Curl_disconnect(data, conn, TRUE);
  }

  return result;
}